

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  float y_scale;
  float x_scale;
  int h;
  int w;
  GLFWvidmode *vid_mode;
  int y;
  int x;
  ImGuiPlatformMonitor monitor;
  int n;
  GLFWmonitor **glfw_monitors;
  int monitors_count;
  ImGuiPlatformIO *platform_io;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ImVec2 in_stack_ffffffffffffffa0;
  ImVec2 local_58;
  GLFWvidmode *local_50;
  int local_48;
  int local_44;
  ImVec2 local_40;
  int local_1c;
  GLFWmonitor **local_18;
  int local_c;
  ImGuiPlatformIO *local_8;
  
  local_8 = ImGui::GetPlatformIO();
  local_c = 0;
  local_18 = glfwGetMonitors((int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  ImVector<ImGuiPlatformMonitor>::resize
            ((ImVector<ImGuiPlatformMonitor> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
            );
  for (local_1c = 0; local_1c < local_c; local_1c = local_1c + 1) {
    ImGuiPlatformMonitor::ImGuiPlatformMonitor
              ((ImGuiPlatformMonitor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
              );
    glfwGetMonitorPos((GLFWmonitor *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                      (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_50 = glfwGetVideoMode((GLFWmonitor *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    ImVec2::ImVec2(&local_58,(float)local_44,(float)local_48);
    local_40 = local_58;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,(float)local_50->width,(float)local_50->height
                  );
    glfwGetMonitorWorkarea
              ((GLFWmonitor *)in_stack_ffffffffffffffa0,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (int *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
               (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,(float)local_44,(float)local_48);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,(float)in_stack_ffffffffffffff9c,
                   (float)in_stack_ffffffffffffff98);
    glfwGetMonitorContentScale
              ((GLFWmonitor *)in_stack_ffffffffffffff90,(float *)in_stack_ffffffffffffff88,
               (float *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    ImVector<ImGuiPlatformMonitor>::push_back
              ((ImVector<ImGuiPlatformMonitor> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (ImGuiPlatformMonitor *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
              );
  }
  g_WantUpdateMonitors = false;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}